

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_duplicate(_glist *x)

{
  t_object *sink;
  t_object *src;
  int iVar1;
  _binbuf *p_Var2;
  void *data;
  _instanceeditor *p_Var3;
  t_editor *ptVar4;
  int iVar5;
  t_selection *ptVar6;
  int nin;
  
  ptVar4 = x->gl_editor;
  if (ptVar4 != (t_editor *)0x0) {
    if ((ptVar4->e_selection != (t_selection *)0x0) && ((ptVar4->field_0x88 & 0x20) != 0)) {
      ptVar4->field_0x88 = ptVar4->field_0x88 & 0xdf;
      _editor_selectlinecolor(x,"black");
      ptVar4 = x->gl_editor;
    }
    if ((ptVar4->field_0x88 & 0x20) == 0) {
      if (((ptVar4->field_0x88 & 7) == 0) && (ptVar4->e_selection != (t_selection *)0x0)) {
        if (*(_binbuf **)(pd_maininstance.pd_gui)->i_editor == (_binbuf *)0x0) {
          p_Var2 = (_binbuf *)0x0;
        }
        else {
          p_Var2 = binbuf_duplicate(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
        }
        canvas_copy(x);
        data = canvas_undo_set_paste(x,0,1,10);
        canvas_undo_add(x,UNDO_PASTE,"duplicate",data);
        canvas_dopaste(x,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
        for (ptVar6 = x->gl_editor->e_selection; ptVar6 != (t_selection *)0x0;
            ptVar6 = ptVar6->sel_next) {
          gobj_displace(ptVar6->sel_what,x,10,10);
        }
        if (p_Var2 != (_binbuf *)0x0) {
          p_Var3 = (pd_maininstance.pd_gui)->i_editor;
          if (*(_binbuf **)p_Var3 != (_binbuf *)0x0) {
            binbuf_free(*(_binbuf **)p_Var3);
            p_Var3 = (pd_maininstance.pd_gui)->i_editor;
          }
          *(_binbuf **)p_Var3 = p_Var2;
        }
        canvas_dirty(x,1.0);
        return;
      }
    }
    else {
      iVar1 = ptVar4->e_selectline_index2;
      sink = (t_object *)x->gl_list;
      src = sink;
      for (iVar5 = ptVar4->e_selectline_index1; iVar5 != 0; iVar5 = iVar5 + -1) {
        src = (t_object *)(src->te_g).g_next;
        if (src == (t_object *)0x0) {
          return;
        }
      }
      for (; iVar1 != 0; iVar1 = iVar1 + -1) {
        sink = (t_object *)(sink->te_g).g_next;
        if (sink == (t_object *)0x0) {
          return;
        }
      }
      iVar1 = ptVar4->e_selectline_outno + 1;
      nin = ptVar4->e_selectline_inno + 1;
      iVar5 = canconnect(x,src,iVar1,sink,nin);
      if (iVar5 == 0) {
        if (src == (t_object *)0x0) {
          return;
        }
        do {
          iVar5 = obj_noutlets(src);
          if (iVar5 <= iVar1) {
            return;
          }
          if (sink == (t_object *)0x0) {
            return;
          }
          iVar5 = obj_ninlets(sink);
          if (iVar5 <= nin) {
            return;
          }
          nin = nin + 1;
          iVar1 = iVar1 + 1;
          iVar5 = canconnect(x,src,iVar1,sink,nin);
        } while (iVar5 == 0);
      }
      iVar5 = tryconnect(x,src,iVar1,sink,nin);
      if (iVar5 != 0) {
        ptVar4 = x->gl_editor;
        ptVar4->e_selectline_outno = iVar1;
        ptVar4->e_selectline_inno = nin;
      }
    }
  }
  return;
}

Assistant:

static void canvas_duplicate(t_canvas *x)
{
    if (!x->gl_editor)
        return;

    if (x->gl_editor->e_selection && x->gl_editor->e_selectedline)
        glist_deselectline(x);

        /* if a connection is selected, we extend it to the right (if possible) */
    if (x->gl_editor->e_selectedline)
    {
        int outindex = x->gl_editor->e_selectline_index1;
        int inindex  = x->gl_editor->e_selectline_index2;
        int outno = x->gl_editor->e_selectline_outno + 1;
        int inno  = x->gl_editor->e_selectline_inno + 1;
        t_gobj *outgobj = 0, *ingobj = 0;
        t_object *outobj = 0, *inobj = 0;
        int whoout = outindex;
        int whoin = inindex;

        for (outgobj = x->gl_list; whoout; outgobj = outgobj->g_next, whoout--)
            if (!outgobj->g_next) return;
        for (ingobj = x->gl_list; whoin; ingobj = ingobj->g_next, whoin--)
            if (!ingobj->g_next) return;
        outobj = (t_object*)outgobj;
        inobj = (t_object*)ingobj;

        while(!canconnect(x, outobj, outno, inobj, inno))
        {
            if (!outobj || obj_noutlets(outobj) <= outno)
                return;
            if (!inobj  || obj_ninlets (inobj ) <= inno )
                return;
            outno++;
            inno++;
        }

        if(tryconnect(x, outobj, outno, inobj, inno))
        {
            x->gl_editor->e_selectline_outno = outno;
            x->gl_editor->e_selectline_inno = inno;
        }
        return;
    }
    if (x->gl_editor->e_onmotion == MA_NONE && x->gl_editor->e_selection)
    {
        t_selection *y;
        t_binbuf*b = 0;
        if(EDITOR->copy_binbuf)
            b = binbuf_duplicate(EDITOR->copy_binbuf);
        canvas_copy(x);
        canvas_undo_add(x, UNDO_PASTE, "duplicate",
            (void *)canvas_undo_set_paste(x, 0, 1, PASTE_OFFSET));
        canvas_dopaste(x, EDITOR->copy_binbuf);
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
            gobj_displace(y->sel_what, x,
                PASTE_OFFSET, PASTE_OFFSET);
        if(b)
        {
            if(EDITOR->copy_binbuf)
                binbuf_free(EDITOR->copy_binbuf);
            EDITOR->copy_binbuf = b;
        }
        canvas_dirty(x, 1);
    }
}